

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O3

GaussianFilter *
pbrt::GaussianFilter::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  Float local_24;
  Float local_20;
  Float local_1c;
  
  local_48._0_8_ = &local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"xradius","");
  local_1c = ParameterDictionary::GetOneFloat(parameters,(string *)local_48,1.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._0_8_ != &local_38) {
    operator_delete((void *)local_48._0_8_,local_38._M_allocated_capacity + 1);
  }
  local_48._0_8_ = &local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"yradius","");
  local_20 = ParameterDictionary::GetOneFloat(parameters,(string *)local_48,1.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._0_8_ != &local_38) {
    operator_delete((void *)local_48._0_8_,local_38._M_allocated_capacity + 1);
  }
  local_48._0_8_ = &local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"sigma","");
  local_24 = ParameterDictionary::GetOneFloat(parameters,(string *)local_48,0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._0_8_ != &local_38) {
    operator_delete((void *)local_48._0_8_,local_38._M_allocated_capacity + 1);
  }
  local_48._4_4_ = local_20;
  local_48._0_4_ = local_1c;
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,200,8);
  GaussianFilter((GaussianFilter *)CONCAT44(extraout_var,iVar1),(Vector2f *)local_48,local_24,alloc)
  ;
  return (GaussianFilter *)CONCAT44(extraout_var,iVar1);
}

Assistant:

GaussianFilter *GaussianFilter::Create(const ParameterDictionary &parameters,
                                       const FileLoc *loc, Allocator alloc) {
    // Find common filter parameters
    Float xw = parameters.GetOneFloat("xradius", 1.5f);
    Float yw = parameters.GetOneFloat("yradius", 1.5f);
    Float sigma = parameters.GetOneFloat("sigma", 0.5f);  // equivalent to old alpha = 2
    return alloc.new_object<GaussianFilter>(Vector2f(xw, yw), sigma, alloc);
}